

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.cpp
# Opt level: O2

flags __thiscall setup::header::load_flags(header *this,istream *is,version *version)

{
  bool bVar1;
  uint16_t uVar2;
  uint uVar3;
  flag_type fVar4;
  stored_flag_reader<flags<setup::header::flags_Enum_,_65UL>_> flagreader;
  
  uVar2 = setup::version::bits(version);
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.pad_bits = (size_t)uVar2;
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.pos = 0;
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.buffer = '\0';
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.result._flags.
  super__Base_bitset<2UL>._M_w[0] = 0;
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.result._flags.
  super__Base_bitset<2UL>._M_w[1] = 0;
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.bytes = 0;
  flagreader.super_stored_flag_reader<setup::header::flags_Enum_>.stream = is;
  stored_flag_reader<setup::header::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,DisableStartupPrompt);
  if (version->value < 0x5030a00) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,Uninstallable);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,CreateAppDir);
  if (version->value < 0x5030300) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,DisableDirPage);
    uVar3 = version->value;
    if (uVar3 < 0x1030600) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 DisableDirExistsWarning);
      uVar3 = version->value;
    }
    if (uVar3 < 0x5030300) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 DisableProgramGroupPage);
    }
  }
  stored_flag_reader<setup::header::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,AllowNoIcons);
  if (version->value + 0xfcfffd00 < 0xfffffd00) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,AlwaysRestart);
    if (version->value < 0x1030300) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,BackSolid);
    }
  }
  stored_flag_reader<setup::header::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,AlwaysUsePersonalGroup
            );
  if (version->value < 0x6040001) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,WindowVisible);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,WindowShowCaption);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,WindowResizable);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,WindowStartMaximized
              );
  }
  stored_flag_reader<setup::header::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
             EnableDirDoesntExistWarning);
  if (version->value < 0x4010200) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,DisableAppendDir);
  }
  stored_flag_reader<setup::header::flags_Enum_>::add
            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,Password);
  if (0x10205ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,AllowRootDirectory);
    if (0x1020dff < version->value) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 DisableFinishedPage);
    }
  }
  uVar2 = setup::version::bits(version);
  uVar3 = version->value;
  if (uVar2 == 0x10) {
LAB_00132e54:
    if (0x102ffff < uVar3) {
      if (uVar3 < 0x5030800) {
        stored_flag_reader<setup::header::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                   CreateUninstallRegKey);
        if (version->value < 0x1030100) goto LAB_00132ed5;
      }
      goto LAB_00132e79;
    }
LAB_00132ed5:
    bVar1 = setup::version::is_isx(version);
    if (!bVar1) goto LAB_00132efa;
    if (0x10309ff < version->value) goto LAB_00132eed;
LAB_00132ffb:
    bVar1 = setup::version::is_isx(version);
    if (!bVar1) goto LAB_0013301c;
    if (0x30002ff < version->value) goto LAB_0013300f;
LAB_0013306e:
    flags<setup::header::flags_Enum_,_65UL>::operator|=(&this->options,AllowCancelDuringInstall);
  }
  else {
    if (uVar3 < 0x3000400) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 AdminPrivilegesRequired);
      uVar3 = version->value;
      if (uVar3 < 0x3000000) {
        stored_flag_reader<setup::header::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                   AlwaysCreateUninstallIcon);
        uVar3 = version->value;
        if (uVar3 < 0x1030600) {
          stored_flag_reader<setup::header::flags_Enum_>::add
                    (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                     OverwriteUninstRegEntries);
          uVar3 = version->value;
        }
      }
    }
    if (uVar3 < 0x5060100) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 ChangesAssociations);
      uVar3 = version->value;
      goto LAB_00132e54;
    }
LAB_00132e79:
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UsePreviousAppDir);
    if (version->value < 0x1030300) goto LAB_00132ed5;
    if (version->value < 0x6040001) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 BackColorHorizontal);
      if (version->value < 0x1030a00) goto LAB_00132ed5;
    }
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UsePreviousGroup);
    if (version->value < 0x1031400) goto LAB_00132ed5;
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               UpdateUninstallLogAppName);
    if (version->value < 0x2000000) goto LAB_00132ed5;
LAB_00132eed:
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UsePreviousSetupType
              );
LAB_00132efa:
    if (version->value < 0x2000000) goto LAB_00132ffb;
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,DisableReadyMemo);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               AlwaysShowComponentsList);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,FlatComponentsList);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,ShowComponentSizes);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UsePreviousTasks);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,DisableReadyPage);
    if (version->value < 0x2000700) goto LAB_00132ffb;
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               AlwaysShowDirOnReadyPage);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               AlwaysShowGroupOnReadyPage);
    if (version->value < 0x2001100) goto LAB_00132ffb;
    if (version->value < 0x4010500) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,BzipUsed);
      if (version->value < 0x2001200) goto LAB_00132ffb;
    }
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,AllowUNCPath);
    if (version->value < 0x3000000) goto LAB_00132ffb;
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UserInfoPage);
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UsePreviousUserInfo)
    ;
    if (version->value < 0x3000100) goto LAB_00132ffb;
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               UninstallRestartComputer);
    if (version->value < 0x3000300) goto LAB_00132ffb;
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,RestartIfNeededByRun
              );
    if (version->value < 0x4000000) goto LAB_00132ffb;
LAB_0013300f:
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,ShowTasksTreeLines);
LAB_0013301c:
    uVar3 = version->value;
    if (uVar3 + 0xfc000000 < 0xa00) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,ShowLanguageDialog
                );
      if (version->value < 0x4000100) goto LAB_0013306e;
      if (version->value < 0x4000a00) {
        stored_flag_reader<setup::header::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                   DetectLanguageUsingLocale);
        uVar3 = version->value;
        goto LAB_00133058;
      }
    }
    else {
LAB_00133058:
      if (uVar3 < 0x4000900) goto LAB_0013306e;
    }
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               AllowCancelDuringInstall);
  }
  if (0x40102ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,WizardImageStretch);
    if (0x40107ff < version->value) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 AppendDefaultDirName);
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 AppendDefaultGroupName);
      if (0x40201ff < version->value) {
        stored_flag_reader<setup::header::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,EncryptionUsed);
        if (0x50003ff < version->value) {
          if (version->value < 0x5060100) {
            stored_flag_reader<setup::header::flags_Enum_>::add
                      (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                       ChangesEnvironment);
            if (version->value < 0x5010700) goto LAB_001331a0;
          }
          bVar1 = setup::version::is_unicode(version);
          if (!bVar1) {
            stored_flag_reader<setup::header::flags_Enum_>::add
                      (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                       ShowUndisplayableLanguages);
          }
          if (0x5010cff < version->value) {
            stored_flag_reader<setup::header::flags_Enum_>::add
                      (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,SetupLogging
                      );
            if (0x50200ff < version->value) {
              stored_flag_reader<setup::header::flags_Enum_>::add
                        (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                         SignedUninstaller);
              if (0x50307ff < version->value) {
                stored_flag_reader<setup::header::flags_Enum_>::add
                          (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                           UsePreviousLanguage);
                if (0x50308ff < version->value) {
                  stored_flag_reader<setup::header::flags_Enum_>::add
                            (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                             DisableWelcomePage);
                  if (0x504ffff < version->value) {
                    stored_flag_reader<setup::header::flags_Enum_>::add
                              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                               CloseApplications);
                    stored_flag_reader<setup::header::flags_Enum_>::add
                              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                               RestartApplications);
                    stored_flag_reader<setup::header::flags_Enum_>::add
                              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                               AllowNetworkDrive);
                    goto LAB_001331b2;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001331a0:
  flags<setup::header::flags_Enum_,_65UL>::operator|=(&this->options,AllowNetworkDrive);
LAB_001331b2:
  if (0x50506ff < version->value) {
    stored_flag_reader<setup::header::flags_Enum_>::add
              (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
               ForceCloseApplications);
    if (0x5ffffff < version->value) {
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,AppNameHasConsts);
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,
                 UsePreviousPrivileges);
      stored_flag_reader<setup::header::flags_Enum_>::add
                (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,WizardResizable);
      if (0x602ffff < version->value) {
        stored_flag_reader<setup::header::flags_Enum_>::add
                  (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>,UninstallLogging
                  );
      }
    }
  }
  fVar4 = stored_flag_reader<setup::header::flags_Enum_>::finalize
                    (&flagreader.super_stored_flag_reader<setup::header::flags_Enum_>);
  return (flags)fVar4._flags.super__Base_bitset<2UL>._M_w;
}

Assistant:

header::flags header::load_flags(std::istream & is, const version & version) {
	
	stored_flag_reader<flags> flagreader(is, version.bits());
	
	flagreader.add(DisableStartupPrompt);
	if(version < INNO_VERSION(5, 3, 10)) {
		flagreader.add(Uninstallable);
	}
	flagreader.add(CreateAppDir);
	if(version < INNO_VERSION(5, 3, 3)) {
		flagreader.add(DisableDirPage);
	}
	if(version < INNO_VERSION(1, 3, 6)) {
		flagreader.add(DisableDirExistsWarning);
	}
	if(version < INNO_VERSION(5, 3, 3)) {
		flagreader.add(DisableProgramGroupPage);
	}
	flagreader.add(AllowNoIcons);
	if(version < INNO_VERSION(3, 0, 0) || version >= INNO_VERSION(3, 0, 3)) {
		flagreader.add(AlwaysRestart);
	}
	if(version < INNO_VERSION(1, 3, 3)) {
		flagreader.add(BackSolid);
	}
	flagreader.add(AlwaysUsePersonalGroup);
	if(version < INNO_VERSION_EXT(6, 4, 0, 1)) {
		flagreader.add(WindowVisible);
		flagreader.add(WindowShowCaption);
		flagreader.add(WindowResizable);
		flagreader.add(WindowStartMaximized);
	}
	flagreader.add(EnableDirDoesntExistWarning);
	if(version < INNO_VERSION(4, 1, 2)) {
		flagreader.add(DisableAppendDir);
	}
	flagreader.add(Password);
	if(version >= INNO_VERSION(1, 2, 6)) {
		flagreader.add(AllowRootDirectory);
	}
	if(version >= INNO_VERSION(1, 2, 14)) {
		flagreader.add(DisableFinishedPage);
	}
	if(version.bits() != 16) {
		if(version < INNO_VERSION(3, 0, 4)) {
			flagreader.add(AdminPrivilegesRequired);
		}
		if(version < INNO_VERSION(3, 0, 0)) {
			flagreader.add(AlwaysCreateUninstallIcon);
		}
		if(version < INNO_VERSION(1, 3, 6)) {
			flagreader.add(OverwriteUninstRegEntries);
		}
		if(version < INNO_VERSION(5, 6, 1)) {
			flagreader.add(ChangesAssociations);
		}
	}
	if(version >= INNO_VERSION(1, 3, 0) && version < INNO_VERSION(5, 3, 8)) {
		flagreader.add(CreateUninstallRegKey);
	}
	if(version >= INNO_VERSION(1, 3, 1)) {
		flagreader.add(UsePreviousAppDir);
	}
	if(version >= INNO_VERSION(1, 3, 3) && version < INNO_VERSION_EXT(6, 4, 0, 1)) {
		flagreader.add(BackColorHorizontal);
	}
	if(version >= INNO_VERSION(1, 3, 10)) {
		flagreader.add(UsePreviousGroup);
	}
	if(version >= INNO_VERSION(1, 3, 20)) {
		flagreader.add(UpdateUninstallLogAppName);
	}
	if(version >= INNO_VERSION(2, 0, 0) || (version.is_isx() && version >= INNO_VERSION(1, 3, 10))) {
		flagreader.add(UsePreviousSetupType);
	}
	if(version >= INNO_VERSION(2, 0, 0)) {
		flagreader.add(DisableReadyMemo);
		flagreader.add(AlwaysShowComponentsList);
		flagreader.add(FlatComponentsList);
		flagreader.add(ShowComponentSizes);
		flagreader.add(UsePreviousTasks);
		flagreader.add(DisableReadyPage);
	}
	if(version >= INNO_VERSION(2, 0, 7)) {
		flagreader.add(AlwaysShowDirOnReadyPage);
		flagreader.add(AlwaysShowGroupOnReadyPage);
	}
	if(version >= INNO_VERSION(2, 0, 17) && version < INNO_VERSION(4, 1, 5)) {
		flagreader.add(BzipUsed);
	}
	if(version >= INNO_VERSION(2, 0, 18)) {
		flagreader.add(AllowUNCPath);
	}
	if(version >= INNO_VERSION(3, 0, 0)) {
		flagreader.add(UserInfoPage);
		flagreader.add(UsePreviousUserInfo);
	}
	if(version >= INNO_VERSION(3, 0, 1)) {
		flagreader.add(UninstallRestartComputer);
	}
	if(version >= INNO_VERSION(3, 0, 3)) {
		flagreader.add(RestartIfNeededByRun);
	}
	if(version >= INNO_VERSION(4, 0, 0) || (version.is_isx() && version >= INNO_VERSION(3, 0, 3))) {
		flagreader.add(ShowTasksTreeLines);
	}
	if(version >= INNO_VERSION(4, 0, 0) && version < INNO_VERSION(4, 0, 10)) {
		flagreader.add(ShowLanguageDialog);
	}
	if(version >= INNO_VERSION(4, 0, 1) && version < INNO_VERSION(4, 0, 10)) {
		flagreader.add(DetectLanguageUsingLocale);
	}
	if(version >= INNO_VERSION(4, 0, 9)) {
		flagreader.add(AllowCancelDuringInstall);
	} else {
		options |= AllowCancelDuringInstall;
	}
	if(version >= INNO_VERSION(4, 1, 3)) {
		flagreader.add(WizardImageStretch);
	}
	if(version >= INNO_VERSION(4, 1, 8)) {
		flagreader.add(AppendDefaultDirName);
		flagreader.add(AppendDefaultGroupName);
	}
	if(version >= INNO_VERSION(4, 2, 2)) {
		flagreader.add(EncryptionUsed);
	}
	if(version >= INNO_VERSION(5, 0, 4) && version < INNO_VERSION(5, 6, 1)) {
		flagreader.add(ChangesEnvironment);
	}
	if(version >= INNO_VERSION(5, 1, 7) && !version.is_unicode()) {
		flagreader.add(ShowUndisplayableLanguages);
	}
	if(version >= INNO_VERSION(5, 1, 13)) {
		flagreader.add(SetupLogging);
	}
	if(version >= INNO_VERSION(5, 2, 1)) {
		flagreader.add(SignedUninstaller);
	}
	if(version >= INNO_VERSION(5, 3, 8)) {
		flagreader.add(UsePreviousLanguage);
	}
	if(version >= INNO_VERSION(5, 3, 9)) {
		flagreader.add(DisableWelcomePage);
	}
	if(version >= INNO_VERSION(5, 5, 0)) {
		flagreader.add(CloseApplications);
		flagreader.add(RestartApplications);
		flagreader.add(AllowNetworkDrive);
	} else {
		options |= AllowNetworkDrive;
	}
	if(version >= INNO_VERSION(5, 5, 7)) {
		flagreader.add(ForceCloseApplications);
	}
	if(version >= INNO_VERSION(6, 0, 0)) {
		flagreader.add(AppNameHasConsts);
		flagreader.add(UsePreviousPrivileges);
		flagreader.add(WizardResizable);
	}
	if(version >= INNO_VERSION(6, 3, 0)) {
		flagreader.add(UninstallLogging);
	}
	
	return flagreader.finalize();
}